

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

InMemoryFileFactory * kj::defaultInMemoryFileFactory(void)

{
  return &defaultInMemoryFileFactory::instance.super_InMemoryFileFactory;
}

Assistant:

const InMemoryFileFactory& defaultInMemoryFileFactory() {
  class FactoryImpl: public InMemoryFileFactory {
  public:
    kj::Own<const File> create(const Clock& clock) const override {
      return newInMemoryFile(clock);
    }
  };
  static const FactoryImpl instance;
  return instance;
}